

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_7::ReplaceTimeAMD
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  Analysis preserved_analyses;
  uint32_t local_f4;
  iterator local_f0;
  undefined8 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  Operand local_b8;
  uint32_t local_84;
  undefined1 local_80 [4];
  uint32_t subgroup_scope_id;
  OperandList args;
  string local_60;
  undefined1 local_40 [8];
  InstructionBuilder ir_builder;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  ir_builder._24_8_ = param_3;
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder((InstructionBuilder *)local_40,ctx,inst,preserved_analyses)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"SPV_KHR_shader_clock",
             (allocator<char> *)
             ((long)&args.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  IRContext::AddExtension(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&args.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  IRContext::AddCapability(ctx,CapabilityShaderClockKHR);
  opt::Instruction::SetOpcode(inst,OpReadClockKHR);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_80);
  local_f4 = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_40,3);
  local_f0 = &local_f4;
  local_e8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_f0;
  local_84 = local_f4;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list);
  Operand::Operand(&local_b8,SPV_OPERAND_TYPE_ID,&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_80,
             &local_b8);
  Operand::~Operand(&local_b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  opt::Instruction::SetInOperands(inst,(OperandList *)local_80);
  IRContext::UpdateDefUse(ctx,inst);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_80);
  return true;
}

Assistant:

bool ReplaceTimeAMD(IRContext* ctx, Instruction* inst,
                    const std::vector<const analysis::Constant*>&) {
  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  ctx->AddExtension("SPV_KHR_shader_clock");
  ctx->AddCapability(spv::Capability::ShaderClockKHR);

  inst->SetOpcode(spv::Op::OpReadClockKHR);
  Instruction::OperandList args;
  uint32_t subgroup_scope_id =
      ir_builder.GetUintConstantId(uint32_t(spv::Scope::Subgroup));
  args.push_back({SPV_OPERAND_TYPE_ID, {subgroup_scope_id}});
  inst->SetInOperands(std::move(args));
  ctx->UpdateDefUse(inst);

  return true;
}